

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_remove_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  _Bool _Var1;
  container_t *c;
  container_t *new_container;
  uint8_t new_typecode;
  uint32_t *puStack_30;
  uint16_t key;
  size_t i;
  uint32_t *puStack_20;
  int32_t pos;
  uint32_t *vals_local;
  size_t n_args_local;
  roaring_bitmap_t *r_local;
  
  if ((n_args != 0) && ((r->high_low_container).size != 0)) {
    i._4_4_ = -1;
    puStack_20 = vals;
    vals_local = (uint32_t *)n_args;
    n_args_local = (size_t)r;
    for (puStack_30 = (uint32_t *)0x0; puStack_30 < vals_local;
        puStack_30 = (uint32_t *)((long)puStack_30 + 1)) {
      new_container._6_2_ = (uint16_t)(puStack_20[(long)puStack_30] >> 0x10);
      if ((i._4_4_ < 0) ||
         (new_container._6_2_ != *(uint16_t *)(*(long *)(n_args_local + 0x10) + (long)i._4_4_ * 2)))
      {
        i._4_4_ = ra_get_index((roaring_array_t *)n_args_local,new_container._6_2_);
      }
      if (-1 < i._4_4_) {
        c = container_remove(*(container_t **)(*(long *)(n_args_local + 8) + (long)i._4_4_ * 8),
                             (uint16_t)puStack_20[(long)puStack_30],
                             *(uint8_t *)(*(long *)(n_args_local + 0x18) + (long)i._4_4_),
                             (uint8_t *)((long)&new_container + 5));
        if (c != *(container_t **)(*(long *)(n_args_local + 8) + (long)i._4_4_ * 8)) {
          container_free(*(container_t **)(*(long *)(n_args_local + 8) + (long)i._4_4_ * 8),
                         *(uint8_t *)(*(long *)(n_args_local + 0x18) + (long)i._4_4_));
          ra_replace_key_and_container_at_index
                    ((roaring_array_t *)n_args_local,i._4_4_,new_container._6_2_,c,
                     new_container._5_1_);
        }
        _Var1 = container_nonzero_cardinality(c,new_container._5_1_);
        if (!_Var1) {
          container_free(c,new_container._5_1_);
          ra_remove_at_index((roaring_array_t *)n_args_local,i._4_4_);
          i._4_4_ = -1;
        }
      }
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove_many(roaring_bitmap_t *r, size_t n_args,
                                const uint32_t *vals) {
    if (n_args == 0 || r->high_low_container.size == 0) {
        return;
    }
    int32_t pos = -1; // position of the container used in the previous iteration
    for (size_t i = 0; i < n_args; i++) {
        uint16_t key = (uint16_t)(vals[i] >> 16);
        if (pos < 0 || key != r->high_low_container.keys[pos]) {
            pos = ra_get_index(&r->high_low_container, key);
        }
        if (pos >= 0) {
            uint8_t new_typecode;
            container_t *new_container;
            new_container = container_remove(r->high_low_container.containers[pos],
                                             vals[i] & 0xffff,
                                             r->high_low_container.typecodes[pos],
                                             &new_typecode);
            if (new_container != r->high_low_container.containers[pos]) {
                container_free(r->high_low_container.containers[pos],
                               r->high_low_container.typecodes[pos]);
                ra_replace_key_and_container_at_index(&r->high_low_container,
                                                      pos, key, new_container,
                                                      new_typecode);
            }
            if (!container_nonzero_cardinality(new_container, new_typecode)) {
                container_free(new_container, new_typecode);
                ra_remove_at_index(&r->high_low_container, pos);
                pos = -1;
            }
        }
    }
}